

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O3

void __thiscall CircularBuffer::Print(CircularBuffer *this,Printer *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  (*p->_vptr_Printer[2])(p,"Circular buffer content:\n<");
  iVar3 = this->outdex;
  iVar2 = 0;
  if (this->empty == false) {
    iVar2 = this->capacity;
  }
  iVar1 = this->index - iVar3;
  if (iVar1 != 0 && iVar3 <= this->index) {
    iVar2 = 0;
  }
  iVar2 = iVar2 + iVar1;
  if (0 < iVar2) {
    do {
      (*p->_vptr_Printer[3])(p,(long)this->buffer[iVar3]);
      iVar3 = iVar3 + 1;
      if (this->capacity <= iVar3) {
        iVar3 = 0;
      }
      if (iVar2 != 1) {
        (*p->_vptr_Printer[2])(p,", ");
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  (*p->_vptr_Printer[2])(p,">\n");
  return;
}

Assistant:

void CircularBuffer::Print(Printer* p)
{
    p->Print("Circular buffer content:\n<");

    int printIndex = outdex;
    int count = index - outdex;

    if (!empty && (index <= outdex))
        count = capacity - (outdex - index);

    for (int i = 0; i < count; i++) {
        p->Print(buffer[printIndex]);
        printIndex = Next(printIndex);
        if (i + 1 != count)
            p->Print(", ");
    }
    p->Print(">\n");
}